

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_function_prototype
          (CompilerHLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  SPIRType *pSVar4;
  SPIRVariable *pSVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Parameter *arg;
  Parameter *pPVar7;
  string out_argument;
  string decl;
  string local_1a0;
  SPIRFunction *local_180;
  long local_178;
  char *local_170;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&(this->super_CompilerGLSL).local_variable_names,
             &(this->super_CompilerGLSL).resource_names._M_h);
  decl._M_dataplus._M_p = (pointer)&decl.field_2;
  decl._M_string_length = 0;
  decl.field_2._M_local_buf[0] = '\0';
  pSVar4 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(func->super_IVariant).field_0xc);
  if ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    CompilerGLSL::flags_to_qualifiers_glsl_abi_cxx11_
              ((string *)&arglist,&this->super_CompilerGLSL,pSVar4,return_flags);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&arglist);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&arglist,this,pSVar4,0);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&arglist);
    ::std::__cxx11::string::append((char *)&decl);
  }
  else {
    ::std::__cxx11::string::assign((char *)&decl);
  }
  uVar1 = (func->super_IVariant).self.id;
  if (uVar1 == (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    get_inner_entry_point_name_abi_cxx11_((string *)&arglist,this);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&arglist);
    (this->super_CompilerGLSL).processing_entry_point = true;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&arglist,this,(ulong)uVar1,1);
    ::std::__cxx11::string::append((string *)&decl);
    ::std::__cxx11::string::~string((string *)&arglist);
  }
  ::std::__cxx11::string::append((char *)&decl);
  arglist.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arglist.stack_storage
  ;
  arglist.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  arglist.buffer_capacity = 8;
  if ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    out_argument._M_dataplus._M_p = (pointer)&out_argument.field_2;
    out_argument._M_string_length = 0;
    out_argument.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::append((char *)&out_argument);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1a0,this,pSVar4,0);
    ::std::__cxx11::string::append((string *)&out_argument);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::append((char *)&out_argument);
    ::std::__cxx11::string::append((char *)&out_argument);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_1a0,this,pSVar4,0);
    ::std::__cxx11::string::append((string *)&out_argument);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&arglist,&out_argument);
    ::std::__cxx11::string::~string((string *)&out_argument);
  }
  pPVar7 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  local_180 = func;
  for (lVar6 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
               * 0x14; lVar6 != 0; lVar6 = lVar6 + -0x14) {
    iVar3 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x37])
                      (this,(ulong)(pPVar7->id).id);
    if ((char)iVar3 == '\0') {
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(pPVar7->id).id);
      local_178 = lVar6;
      CompilerGLSL::argument_decl_abi_cxx11_(&out_argument,&this->super_CompilerGLSL,pPVar7);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&arglist,&out_argument);
      ::std::__cxx11::string::~string((string *)&out_argument);
      pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pPVar7->type).id);
      if (((0x1e < (this->hlsl_options).shader_model) && (pSVar4->basetype == SampledImage)) &&
         ((pSVar4->image).dim != DimBuffer)) {
        bVar2 = Compiler::is_depth_image((Compiler *)this,pSVar4,(pPVar7->id).id);
        local_170 = "SamplerState ";
        if (bVar2) {
          local_170 = "SamplerComparisonState ";
        }
        to_sampler_expression_abi_cxx11_(&local_1a0,this,(pPVar7->id).id);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                  (&local_50,this,pSVar4,(ulong)(pPVar7->id).id);
        join<char_const*,std::__cxx11::string,std::__cxx11::string>
                  (&out_argument,(spirv_cross *)&local_170,(char **)&local_1a0,&local_50,in_R8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&arglist,&out_argument);
        ::std::__cxx11::string::~string((string *)&out_argument);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_1a0);
      }
      pSVar5 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,(pPVar7->id).id);
      lVar6 = local_178;
      if (pSVar5 != (SPIRVariable *)0x0) {
        pSVar5->parameter = pPVar7;
      }
    }
    pPVar7 = pPVar7 + 1;
  }
  pPVar7 = (local_180->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  for (lVar6 = (local_180->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
               buffer_size * 0x14; lVar6 != 0; lVar6 = lVar6 + -0x14) {
    CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(pPVar7->id).id);
    CompilerGLSL::argument_decl_abi_cxx11_(&out_argument,&this->super_CompilerGLSL,pPVar7);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&arglist,&out_argument);
    ::std::__cxx11::string::~string((string *)&out_argument);
    pSVar5 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,(pPVar7->id).id);
    if (pSVar5 != (SPIRVariable *)0x0) {
      pSVar5->parameter = pPVar7;
    }
    pPVar7 = pPVar7 + 1;
  }
  merge(&out_argument,&arglist,", ");
  ::std::__cxx11::string::append((string *)&decl);
  ::std::__cxx11::string::~string((string *)&out_argument);
  ::std::__cxx11::string::append((char *)&decl);
  CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&decl);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&arglist);
  ::std::__cxx11::string::~string((string *)&decl);
  return;
}

Assistant:

void CompilerHLSL::emit_function_prototype(SPIRFunction &func, const Bitset &return_flags)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	// Avoid shadow declarations.
	local_variable_names = resource_names;

	string decl;

	auto &type = get<SPIRType>(func.return_type);
	if (type.array.empty())
	{
		decl += flags_to_qualifiers_glsl(type, return_flags);
		decl += type_to_glsl(type);
		decl += " ";
	}
	else
	{
		// We cannot return arrays in HLSL, so "return" through an out variable.
		decl = "void ";
	}

	if (func.self == ir.default_entry_point)
	{
		decl += get_inner_entry_point_name();
		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	SmallVector<string> arglist;

	if (!type.array.empty())
	{
		// Fake array returns by writing to an out array instead.
		string out_argument;
		out_argument += "out ";
		out_argument += type_to_glsl(type);
		out_argument += " ";
		out_argument += "spvReturnValue";
		out_argument += type_to_array_glsl(type, 0);
		arglist.push_back(std::move(out_argument));
	}

	for (auto &arg : func.arguments)
	{
		// Do not pass in separate images or samplers if we're remapping
		// to combined image samplers.
		if (skip_argument(arg.id))
			continue;

		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Flatten a combined sampler to two separate arguments in modern HLSL.
		auto &arg_type = get<SPIRType>(arg.type);
		if (hlsl_options.shader_model > 30 && arg_type.basetype == SPIRType::SampledImage &&
		    arg_type.image.dim != DimBuffer)
		{
			// Manufacture automatic sampler arg for SampledImage texture
			arglist.push_back(join(is_depth_image(arg_type, arg.id) ? "SamplerComparisonState " : "SamplerState ",
			                       to_sampler_expression(arg.id), type_to_array_glsl(arg_type, arg.id)));
		}

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	for (auto &arg : func.shadow_arguments)
	{
		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += merge(arglist);
	decl += ")";
	statement(decl);
}